

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall deqp::egl::GLES2ThreadTest::Operation::execute(Operation *this,Thread *t)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  bool bVar3;
  Result RVar4;
  GLenum GVar5;
  EGLThread *thread;
  pointer pSVar6;
  pointer pSVar7;
  bool bVar8;
  long lVar9;
  EGLThread *eglThread;
  long lVar10;
  undefined1 local_1b8 [136];
  ios_base local_130 [264];
  
  thread = (EGLThread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (thread == (EGLThread *)0x0) {
    __cxa_bad_cast();
  }
  pSVar6 = (this->super_Operation).m_deps.
           super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar8 = true;
  if (0 < (int)((ulong)((long)(this->super_Operation).m_deps.
                              super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6) >> 4)) {
    lVar10 = 0;
    lVar9 = 0;
    do {
      RVar4 = tcu::ThreadUtil::Event::waitReady(*(Event **)((long)&pSVar6->m_ptr + lVar10));
      if (RVar4 == RESULT_NOT_READY) {
        bVar8 = false;
      }
      lVar9 = lVar9 + 1;
      pSVar6 = (this->super_Operation).m_deps.
               super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x10;
    } while (lVar9 < (int)((ulong)((long)(this->super_Operation).m_deps.
                                         super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6)
                          >> 4));
    if (!bVar8) goto LAB_00de7b67;
  }
  if (this->m_useSync == true) {
    pSVar7 = (this->m_syncDeps).
             super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_syncDeps).
                                super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7) >> 4)) {
      lVar10 = 0;
      lVar9 = 0;
      do {
        bVar3 = FenceSync::waitReady(*(FenceSync **)((long)&pSVar7->m_ptr + lVar10),thread);
        if (!bVar3) goto LAB_00de7b72;
        lVar9 = lVar9 + 1;
        pSVar7 = (this->m_syncDeps).
                 super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = lVar10 + 0x10;
      } while (lVar9 < (int)((ulong)((long)(this->m_syncDeps).
                                           super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7
                                    ) >> 4));
    }
  }
  if (bVar8) {
    (*(this->super_Operation)._vptr_Operation[2])(this,thread);
    local_1b8._0_8_ = thread;
    if (this->m_useSync == true) {
      FenceSync::init((this->m_sync).m_ptr,(EVP_PKEY_CTX *)thread);
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x18),"Begin -- glFlush()",0x12);
      tcu::ThreadUtil::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
      std::ios_base::~ios_base(local_130);
      (*thread->gl->flush)();
      GVar5 = (*thread->gl->getError)();
      glu::checkError(GVar5,"flush()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                      ,0x1e7);
      local_1b8._0_8_ = thread;
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x18),"End -- glFlush()",0x10);
      tcu::ThreadUtil::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x18),"Begin -- glFinish()",0x13);
      tcu::ThreadUtil::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
      std::ios_base::~ios_base(local_130);
      (*thread->gl->finish)();
      GVar5 = (*thread->gl->getError)();
      glu::checkError(GVar5,"finish()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                      ,0x1ed);
      local_1b8._0_8_ = thread;
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x18),"End -- glFinish()",0x11);
      tcu::ThreadUtil::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
  }
LAB_00de7b67:
  RVar4 = RESULT_OK;
  if (!bVar8) {
LAB_00de7b72:
    RVar4 = RESULT_FAILED;
  }
  tcu::ThreadUtil::Event::setResult((this->super_Operation).m_event.m_ptr,RVar4);
  std::
  vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ::_M_erase_at_end(&(this->super_Operation).m_deps,
                    (this->super_Operation).m_deps.
                    super__Vector_base<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pSVar2 = (this->super_Operation).m_event.m_state;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar2->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->super_Operation).m_event.m_ptr = (Event *)0x0;
      (*((this->super_Operation).m_event.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->super_Operation).m_event.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar2 = (this->super_Operation).m_event.m_state;
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        (*pSVar2->_vptr_SharedPtrStateBase[1])();
      }
      (this->super_Operation).m_event.m_state = (SharedPtrStateBase *)0x0;
    }
    (this->super_Operation).m_event.m_ptr = (Event *)0x0;
    (this->super_Operation).m_event.m_state = (SharedPtrStateBase *)0x0;
  }
  std::
  vector<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
  ::_M_erase_at_end(&this->m_syncDeps,
                    (this->m_syncDeps).
                    super__Vector_base<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>,_std::allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pSVar2 = (this->m_sync).m_state;
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar2->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->m_sync).m_ptr = (FenceSync *)0x0;
      (*((this->m_sync).m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->m_sync).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar2 = (this->m_sync).m_state;
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        (*pSVar2->_vptr_SharedPtrStateBase[1])();
      }
      (this->m_sync).m_state = (SharedPtrStateBase *)0x0;
    }
    (this->m_sync).m_ptr = (FenceSync *)0x0;
    (this->m_sync).m_state = (SharedPtrStateBase *)0x0;
  }
  return;
}

Assistant:

void Operation::execute (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	bool success = true;

	// Wait for dependencies and check that they succeeded
	for (int depNdx = 0; depNdx < (int)m_deps.size(); depNdx++)
	{
		if (!m_deps[depNdx]->waitReady())
			success = false;
	}

	// Try execute operation
	if (success)
	{
		try
		{
			if (m_useSync)
			{
				for (int depNdx = 0; depNdx < (int)m_syncDeps.size(); depNdx++)
				{
					EGLThread* eglThread = dynamic_cast<EGLThread*>(&thread);
					DE_ASSERT(eglThread);
					if (m_syncDeps[depNdx]->waitReady(*eglThread) != tcu::ThreadUtil::Event::RESULT_OK)
					{
						success = false;
						break;
					}
				}
			}

			if (success)
			{
				exec(thread);
				if (m_useSync)
				{
					EGLThread* eglThread = dynamic_cast<EGLThread*>(&thread);
					DE_ASSERT(eglThread);
					m_sync->init(*eglThread, m_serverSync);
					thread.newMessage() << "Begin -- glFlush()" << tcu::ThreadUtil::Message::End;
					GLU_CHECK_GLW_CALL(thread.gl, flush());
					thread.newMessage() << "End -- glFlush()" << tcu::ThreadUtil::Message::End;
				}
				else
				{
					thread.newMessage() << "Begin -- glFinish()" << tcu::ThreadUtil::Message::End;
					GLU_CHECK_GLW_CALL(thread.gl, finish());
					thread.newMessage() << "End -- glFinish()" << tcu::ThreadUtil::Message::End;
				}
			}
		}
		catch (...)
		{
			// Got exception event failed
			m_event->setResult(tcu::ThreadUtil::Event::RESULT_FAILED);
			throw;
		}
	}

	if (success)
		m_event->setResult(tcu::ThreadUtil::Event::RESULT_OK);
	else
		m_event->setResult(tcu::ThreadUtil::Event::RESULT_FAILED);

	m_deps.clear();
	m_event = SharedPtr<tcu::ThreadUtil::Event>();
	m_syncDeps.clear();
	m_sync = SharedPtr<FenceSync>();
}